

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvars.cc
# Opt level: O0

ostream * tchecker::output(ostream *os,intval_t *intval,intvar_index_t *index)

{
  intval_t *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  int *piVar4;
  uint local_2c;
  size_t sStack_28;
  intvar_id_t id;
  size_t size;
  intvar_index_t *index_local;
  intval_t *intval_local;
  ostream *os_local;
  
  size = (size_t)index;
  index_local = (intvar_index_t *)intval;
  intval_local = (intval_t *)os;
  sStack_28 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(index);
  for (local_2c = 0; local_2c < sStack_28; local_2c = local_2c + 1) {
    if (local_2c != 0) {
      std::operator<<((ostream *)intval_local,",");
    }
    piVar1 = intval_local;
    pbVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)size,&local_2c);
    poVar3 = std::operator<<((ostream *)piVar1,(string *)pbVar2);
    poVar3 = std::operator<<(poVar3,"=");
    piVar4 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                       ((make_array_t<int,_4UL,_tchecker::intval_base_t> *)index_local,
                        (capacity_t_conflict)local_2c);
    std::ostream::operator<<(poVar3,*piVar4);
  }
  return (ostream *)intval_local;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::intval_t const & intval, tchecker::intvar_index_t const & index)
{
  auto const size = index.size();

  for (tchecker::intvar_id_t id = 0; id < size; ++id) {
    if (id > 0)
      os << ",";
    os << index.value(id) << "=" << intval[id];
  }
  return os;
}